

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-ncurses.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_38c6c::VSync::VSync(VSync *this,double fps_active,double fps_idle)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  undefined1 auVar4 [16];
  
  auVar4._8_8_ = fps_idle;
  auVar4._0_8_ = fps_active;
  auVar4 = divpd(_DAT_00155c50,auVar4);
  uVar1 = (ulong)auVar4._0_8_;
  uVar2 = (ulong)auVar4._8_8_;
  this->tStepActive_us = (long)(auVar4._0_8_ - 9.223372036854776e+18) & (long)uVar1 >> 0x3f | uVar1;
  this->tStepIdle_us = (long)(auVar4._8_8_ - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
  lVar3 = std::chrono::_V2::system_clock::now();
  this->tLast_us = lVar3 / 1000;
  this->tNext_us = lVar3 / 1000;
  return;
}

Assistant:

VSync(double fps_active = 60.0, double fps_idle = 60.0) :
            tStepActive_us(1000000.0/fps_active),
            tStepIdle_us(1000000.0/fps_idle) {}